

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::tracker_alert::message_abi_cxx11_(string *__return_storage_ptr__,tracker_alert *this)

{
  char *__rhs;
  endpoint *ep;
  string sStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&local_d8,&local_38," (");
  __rhs = tracker_url(this);
  std::operator+(&local_b8,&local_d8,__rhs);
  std::operator+(&local_98,&local_b8,")");
  std::operator+(&local_78,&local_98,"[");
  print_endpoint_abi_cxx11_(&sStack_f8,(libtorrent *)&this->local_endpoint,ep);
  std::operator+(&local_58,&local_78,&sStack_f8);
  std::operator+(__return_storage_ptr__,&local_58,"]");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_alert::message() const
	{
		return torrent_alert::message() + " (" + tracker_url() + ")"
			+ "[" + print_endpoint(local_endpoint) + "]";
	}